

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O3

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDeleteBound(LifeTest *this)

{
  _func_int *p_Var1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  char *msg;
  ResultCollector errors;
  ResultCollector local_30;
  
  uVar2 = (*this->m_type->_vptr_Type[2])();
  local_30.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  local_30.m_log = (local_30.m_testCtx)->m_log;
  local_30.m_result = QP_TEST_RESULT_PASS;
  local_30.m_message = "Pass";
  iVar3 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),uVar2);
  (*this->m_type->_vptr_Type[3])(this->m_type,(ulong)uVar2);
  iVar3 = (*this->m_type->_vptr_Type[8])();
  p_Var1 = ((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3];
  if ((char)iVar3 == '\0') {
    iVar3 = (*p_Var1)();
    iVar3 = (**(code **)(CONCAT44(extraout_var_02,iVar3) + 0x800))();
    if (iVar3 != 0) {
      ResultCollector::addResult(&local_30,QP_TEST_RESULT_FAIL,"Deleting bound object failed");
    }
    iVar3 = (*this->m_type->_vptr_Type[6])();
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_03,iVar3));
    if (iVar3 != 0) {
      ResultCollector::addResult
                (&local_30,QP_TEST_RESULT_FAIL,"Deleting bound object did not remove binding");
    }
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar2);
    if ((char)iVar3 == '\0') goto LAB_004692ee;
    msg = "Deleting bound object did not make its name invalid";
  }
  else {
    iVar3 = (*p_Var1)();
    iVar3 = (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
    if (iVar3 != 0) {
      ResultCollector::addResult(&local_30,QP_TEST_RESULT_FAIL,"Deleting bound object failed");
    }
    iVar3 = (*this->m_type->_vptr_Type[6])();
    uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_01,iVar3));
    if (uVar4 != uVar2) {
      ResultCollector::addResult
                (&local_30,QP_TEST_RESULT_FAIL,"Deleting bound object did not retain binding");
    }
    iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar2);
    if ((char)iVar3 == '\0') {
      ResultCollector::addResult
                (&local_30,QP_TEST_RESULT_FAIL,"Deleting bound object made its name invalid");
    }
    iVar3 = (*this->m_type->_vptr_Type[5])(this->m_type,(ulong)uVar2);
    if ((char)iVar3 != '\0') goto LAB_004692ee;
    msg = "Deleting bound object did not flag the object for deletion";
  }
  ResultCollector::addResult(&local_30,QP_TEST_RESULT_FAIL,msg);
LAB_004692ee:
  iVar3 = (*this->m_type->_vptr_Type[6])();
  (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var_04,iVar3),0);
  iVar3 = (*this->m_type->_vptr_Type[6])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x18))
                    ((long *)CONCAT44(extraout_var_05,iVar3));
  if (iVar3 != 0) {
    ResultCollector::addResult(&local_30,QP_TEST_RESULT_FAIL,"Unbinding didn\'t remove binding");
  }
  iVar3 = (*this->m_type->_vptr_Type[4])(this->m_type,(ulong)uVar2);
  if ((char)iVar3 != '\0') {
    ResultCollector::addResult
              (&local_30,QP_TEST_RESULT_FAIL,"Name is still valid after deleting and unbinding");
  }
  ResultCollector::~ResultCollector(&local_30);
  return;
}

Assistant:

void LifeTest::testDeleteBound (void)
{
	const GLuint	id		= m_type.gen();
	ResultCollector	errors	(getTestContext());

	binder().bind(id);
	m_type.release(id);

	if (m_type.nameLingers())
	{
		errors.check(gl().getError() == GL_NO_ERROR, "Deleting bound object failed");
		errors.check(binder().getBinding() == id,
					 "Deleting bound object did not retain binding");
		errors.check(m_type.exists(id),
					 "Deleting bound object made its name invalid");
		errors.check(m_type.isDeleteFlagged(id),
					 "Deleting bound object did not flag the object for deletion");
		binder().bind(0);
	}
	else
	{
		errors.check(gl().getError() == GL_NO_ERROR, "Deleting bound object failed");
		errors.check(binder().getBinding() == 0,
					 "Deleting bound object did not remove binding");
		errors.check(!m_type.exists(id),
					 "Deleting bound object did not make its name invalid");
		binder().bind(0);
	}

	errors.check(binder().getBinding() == 0, "Unbinding didn't remove binding");
	errors.check(!m_type.exists(id), "Name is still valid after deleting and unbinding");
}